

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_object_type_e
trap_oh_errors<qpdf_object_type_e>
          (qpdf_data qpdf,function<qpdf_object_type_e_()> *fallback,
          function<qpdf_object_type_e_(_qpdf_data_*)> *fn)

{
  uint uVar1;
  function<qpdf_object_type_e_()> *this;
  element_type *this_00;
  element_type *peVar2;
  element_type *this_01;
  element_type *peVar3;
  char *cstr;
  Pipeline *this_02;
  shared_ptr<QPDFLogger> local_d0;
  QPDFLogger local_c0;
  int local_ac;
  string local_a8;
  qpdf_error_code_e local_88 [4];
  anon_class_40_2_c964147e local_78;
  function<void_(_qpdf_data_*)> local_50;
  uint local_30;
  qpdf_object_type_e local_2c;
  QPDF_ERROR_CODE status;
  qpdf_object_type_e ret;
  function<qpdf_object_type_e_(_qpdf_data_*)> *fn_local;
  function<qpdf_object_type_e_()> *fallback_local;
  qpdf_data qpdf_local;
  
  local_78.ret = &local_2c;
  _status = fn;
  fn_local = (function<qpdf_object_type_e_(_qpdf_data_*)> *)fallback;
  fallback_local = (function<qpdf_object_type_e_()> *)qpdf;
  std::function<qpdf_object_type_e_(_qpdf_data_*)>::function(&local_78.fn,fn);
  std::function<void(_qpdf_data*)>::
  function<trap_oh_errors<qpdf_object_type_e>(_qpdf_data*,std::function<qpdf_object_type_e()>,std::function<qpdf_object_type_e(_qpdf_data*)>)::_lambda(_qpdf_data*)_1_,void>
            ((function<void(_qpdf_data*)> *)&local_50,&local_78);
  uVar1 = trap_errors(qpdf,&local_50);
  std::function<void_(_qpdf_data_*)>::~function(&local_50);
  trap_oh_errors<qpdf_object_type_e>(_qpdf_data*,std::function<qpdf_object_type_e()>,std::function<qpdf_object_type_e(_qpdf_data*)>)
  ::{lambda(_qpdf_data*)#1}::~function((_lambda__qpdf_data___1_ *)&local_78);
  if ((uVar1 & 2) == 0) {
    qpdf_local._4_4_ = local_2c;
  }
  else {
    local_30 = uVar1;
    if (((ulong)fallback_local[5].super__Function_base._M_manager & 1) == 0) {
      QTC::TC("qpdf","qpdf-c warn about oh error",
              (uint)(((ulong)fallback_local[5].super__Function_base._M_manager & 0x100) == 0));
      if (((ulong)fallback_local[5].super__Function_base._M_manager & 0x100) == 0) {
        this = fallback_local + 2;
        local_88[0] = qpdf_e_internal;
        this_00 = std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             fallback_local);
        QPDF::getFilename_abi_cxx11_(&local_a8,this_00);
        local_ac = 0;
        std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
        emplace_back<qpdf_error_code_e,std::__cxx11::string,char_const(&)[1],int,char_const(&)[129]>
                  ((list<QPDFExc,std::allocator<QPDFExc>> *)this,local_88,&local_a8,
                   (char (*) [1])0x42fa30,&local_ac,
                   (char (*) [129])
                   "C API function caught an exception that it isn\'t returning; please point the application developer to ERROR HANDLING in qpdf-c.h"
                  );
        std::__cxx11::string::~string((string *)&local_a8);
        *(undefined1 *)((long)&fallback_local[5].super__Function_base._M_manager + 1) = 1;
      }
      QPDFLogger::defaultLogger();
      peVar2 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_d0);
      QPDFLogger::getError(&local_c0,SUB81(peVar2,0));
      this_01 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )&local_c0);
      peVar3 = std::__shared_ptr_access<QPDFExc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFExc,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          (fallback_local + 1));
      cstr = (char *)(**(code **)(*(long *)peVar3 + 0x10))();
      this_02 = Pipeline::operator<<(this_01,cstr);
      Pipeline::operator<<(this_02,"\n");
      std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_c0);
      std::shared_ptr<QPDFLogger>::~shared_ptr(&local_d0);
    }
    qpdf_local._4_4_ = std::function<qpdf_object_type_e_()>::operator()(fallback);
  }
  return qpdf_local._4_4_;
}

Assistant:

static RET
trap_oh_errors(qpdf_data qpdf, std::function<RET()> fallback, std::function<RET(qpdf_data)> fn)
{
    // Note: fallback is a function so we don't have to evaluate it unless needed. This is important
    // because sometimes the fallback creates an object.
    RET ret;
    QPDF_ERROR_CODE status = trap_errors(qpdf, [&ret, fn](qpdf_data q) { ret = fn(q); });
    if (status & QPDF_ERRORS) {
        if (!qpdf->silence_errors) {
            QTC::TC("qpdf", "qpdf-c warn about oh error", qpdf->oh_error_occurred ? 0 : 1);
            if (!qpdf->oh_error_occurred) {
                qpdf->warnings.emplace_back(
                    qpdf_e_internal,
                    qpdf->qpdf->getFilename(),
                    "",
                    0,
                    "C API function caught an exception that it isn't returning; please point the "
                    "application developer to ERROR HANDLING in qpdf-c.h");
                qpdf->oh_error_occurred = true;
            }
            *QPDFLogger::defaultLogger()->getError() << qpdf->error->what() << "\n";
        }
        return fallback();
    }
    return ret;
}